

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_chain
          (Impl *this,void *pNext,ScratchAllocator *alloc,void **out_pnext,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkStructureType VVar1;
  bool bVar2;
  LogLevel LVar3;
  _Node_iterator_base<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_false>
  create_info;
  pointer ppVar4;
  VkPipelineCreateFlags2KHR VVar5;
  void *pvVar6;
  VkRenderingInputAttachmentIndexInfoKHR *ci_42;
  VkRenderingAttachmentLocationInfoKHR *ci_41;
  VkPipelineViewportDepthClampControlCreateInfoEXT *ci_40;
  VkPipelineRobustnessCreateInfoEXT *ci_39;
  VkSampleLocationsInfoEXT *ci_38;
  VkRenderPassFragmentDensityMapCreateInfoEXT *ci_37;
  VkDepthBiasRepresentationInfoEXT *ci_36;
  VkMultisampledRenderToSingleSampledInfoEXT *ci_35;
  VkSamplerBorderColorComponentMappingCreateInfoEXT *ci_34;
  VkRenderPassCreationControlEXT *ci_33;
  VkPipelineCreateFlags2CreateInfoKHR *flags2;
  VkPipelineCreateFlags2CreateInfoKHR *ci_32;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *ci_31;
  VkPipelineViewportDepthClipControlCreateInfoEXT *ci_30;
  VkPipelineLibraryCreateInfoKHR *ci_29;
  VkShaderModuleCreateInfo *new_module;
  VkShaderModuleCreateInfo *ci_28;
  VkGraphicsPipelineLibraryCreateInfoEXT *ci_27;
  VkSamplerYcbcrConversionCreateInfo *new_create_info;
  _Node_iterator_base<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_false>
  local_150;
  iterator ycbcr;
  VkSamplerYcbcrConversionInfo *ci_26;
  VkSamplerYcbcrConversionCreateInfo *ci_25;
  VkPipelineFragmentShadingRateStateCreateInfoKHR *ci_24;
  VkMemoryBarrier2KHR *ci_23;
  VkPipelineDiscardRectangleStateCreateInfoEXT *ci_22;
  VkRenderPassInputAttachmentAspectCreateInfo *ci_21;
  VkSamplerReductionModeCreateInfo *ci_20;
  VkSamplerCustomBorderColorCreateInfoEXT *ci_19;
  VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *ci_18;
  VkPipelineSampleLocationsStateCreateInfoEXT *ci_17;
  VkPipelineColorWriteCreateInfoEXT *ci_16;
  VkPipelineRenderingCreateInfoKHR *ci_15;
  VkBaseInStructure *rate;
  VkFragmentShadingRateAttachmentInfoKHR *ci_14;
  VkBaseInStructure *resolve;
  VkSubpassDescriptionDepthStencilResolve *ci_13;
  VkAttachmentReferenceStencilLayout *ci_12;
  VkAttachmentDescriptionStencilLayout *ci_11;
  VkMutableDescriptorTypeCreateInfoEXT *ci_10;
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *ci_9;
  VkPipelineRasterizationLineStateCreateInfoKHR *ci_8;
  VkPipelineRasterizationConservativeStateCreateInfoEXT *ci_7;
  VkPipelineColorBlendAdvancedStateCreateInfoEXT *ci_6;
  VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *ci_5;
  VkRenderPassMultiviewCreateInfo *ci_4;
  VkPipelineRasterizationStateStreamCreateInfoEXT *ci_3;
  VkPipelineRasterizationDepthClipStateCreateInfoEXT *ci_2;
  VkPipelineVertexInputDivisorStateCreateInfoKHR *ci_1;
  VkPipelineTessellationDomainOriginStateCreateInfo *ci;
  VkBaseInStructure *pin;
  VkBaseInStructure **ppNext;
  VkBaseInStructure new_pnext;
  VkGraphicsPipelineLibraryFlagsEXT state_flags_local;
  DynamicStateInfo *dynamic_state_info_local;
  void **out_pnext_local;
  ScratchAllocator *alloc_local;
  void *pNext_local;
  Impl *this_local;
  
  new_pnext.pNext._4_4_ = state_flags;
  memset(&ppNext,0,0x10);
  pin = &new_pnext;
  alloc_local = (ScratchAllocator *)pNext;
  do {
    create_info._M_cur = (__node_type *)pnext_chain_skip_ignored_entries(alloc_local);
    if ((VkSamplerYcbcrConversionCreateInfo *)create_info._M_cur ==
        (VkSamplerYcbcrConversionCreateInfo *)0x0) {
      *out_pnext = (void *)new_pnext._0_8_;
      return true;
    }
    VVar1 = *(VkStructureType *)&((create_info._M_cur)->super__Hash_node_base)._M_nxt;
    if (VVar1 == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) {
      ci_29 = (VkPipelineLibraryCreateInfoKHR *)0x0;
      new_module = (VkShaderModuleCreateInfo *)create_info._M_cur;
      bVar2 = copy_shader_module(this,(VkShaderModuleCreateInfo *)create_info._M_cur,alloc,true,
                                 (VkShaderModuleCreateInfo **)&ci_29);
      if (!bVar2) {
        return false;
      }
      *(VkPipelineLibraryCreateInfoKHR **)pin = ci_29;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT) {
      pvVar6 = copy_pnext_struct_simple<VkPipelineRasterizationStateStreamCreateInfoEXT>
                         (this,(VkPipelineRasterizationStateStreamCreateInfoEXT *)create_info._M_cur
                          ,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO) {
      pvVar6 = copy_pnext_struct(this,(VkPipelineRenderingCreateInfoKHR *)create_info._M_cur,alloc,
                                 new_pnext.pNext._4_4_);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO) {
      pvVar6 = copy_pnext_struct(this,(VkRenderPassMultiviewCreateInfo *)create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO) {
      pvVar6 = copy_pnext_struct_simple<VkPipelineRobustnessCreateInfo>
                         (this,(VkPipelineRobustnessCreateInfo *)create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT) {
      pvVar6 = copy_pnext_struct(this,(VkPipelineDiscardRectangleStateCreateInfoEXT *)
                                      create_info._M_cur,alloc,dynamic_state_info);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT) {
      pvVar6 = copy_pnext_struct_simple<VkPipelineRasterizationConservativeStateCreateInfoEXT>
                         (this,(VkPipelineRasterizationConservativeStateCreateInfoEXT *)
                               create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT) {
      pvVar6 = copy_pnext_struct_simple<VkPipelineRasterizationDepthClipStateCreateInfoEXT>
                         (this,(VkPipelineRasterizationDepthClipStateCreateInfoEXT *)
                               create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO) {
      pvVar6 = copy_pnext_struct(this,(VkRenderPassInputAttachmentAspectCreateInfo *)
                                      create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO) {
      pvVar6 = copy_pnext_struct_simple<VkPipelineTessellationDomainOriginStateCreateInfo>
                         (this,(VkPipelineTessellationDomainOriginStateCreateInfo *)
                               create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO) {
      pvVar6 = copy_pnext_struct_simple<VkSamplerReductionModeCreateInfo>
                         (this,(VkSamplerReductionModeCreateInfo *)create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT) {
      pvVar6 = copy_pnext_struct(this,(VkSampleLocationsInfoEXT *)create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT) {
      pvVar6 = copy_pnext_struct(this,(VkPipelineSampleLocationsStateCreateInfoEXT *)
                                      create_info._M_cur,alloc,dynamic_state_info);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT) {
      pvVar6 = copy_pnext_struct_simple<VkPipelineColorBlendAdvancedStateCreateInfoEXT>
                         (this,(VkPipelineColorBlendAdvancedStateCreateInfoEXT *)create_info._M_cur,
                          alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO) {
      pvVar6 = copy_pnext_struct_simple<VkSamplerYcbcrConversionCreateInfo>
                         (this,(VkSamplerYcbcrConversionCreateInfo *)create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO) {
      ycbcr.
      super__Node_iterator_base<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_false>
                 )(_Node_iterator_base<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_false>
                   )create_info._M_cur;
      local_150._M_cur =
           (__node_type *)
           std::
           unordered_map<VkSamplerYcbcrConversion_T_*,_const_VkSamplerYcbcrConversionCreateInfo_*,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>_>
           ::find(&this->ycbcr_conversions,
                  (key_type *)
                  ((long)&((create_info._M_cur)->
                          super__Hash_node_value<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_false>
                          ).
                          super__Hash_node_value_base<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>
                          ._M_storage._M_storage + 8));
      new_create_info =
           (VkSamplerYcbcrConversionCreateInfo *)
           std::
           unordered_map<VkSamplerYcbcrConversion_T_*,_const_VkSamplerYcbcrConversionCreateInfo_*,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>_>
           ::end(&this->ycbcr_conversions);
      bVar2 = std::__detail::operator==
                        (&local_150,
                         (_Node_iterator_base<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_false>
                          *)&new_create_info);
      if (bVar2) {
        return false;
      }
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_false,_false>
                             *)&local_150);
      bVar2 = copy_ycbcr_conversion
                        (this,ppVar4->second,alloc,(VkSamplerYcbcrConversionCreateInfo **)&ci_27);
      if (!bVar2) {
        return false;
      }
      *(VkGraphicsPipelineLibraryCreateInfoEXT **)pin = ci_27;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO) {
      pvVar6 = copy_pnext_struct(this,(VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *)
                                      create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO) {
      pvVar6 = copy_pnext_struct(this,(VkPipelineVertexInputDivisorStateCreateInfoKHR *)
                                      create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE) {
      pvVar6 = copy_pnext_struct(this,(VkSubpassDescriptionDepthStencilResolve *)create_info._M_cur,
                                 alloc);
      if (pvVar6 == (void *)0x0) {
        return false;
      }
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT) {
      pvVar6 = copy_pnext_struct_simple<VkRenderPassFragmentDensityMapCreateInfoEXT>
                         (this,(VkRenderPassFragmentDensityMapCreateInfoEXT *)create_info._M_cur,
                          alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO) {
      pvVar6 = copy_pnext_struct_simple<VkPipelineShaderStageRequiredSubgroupSizeCreateInfo>
                         (this,(VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *)
                               create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR) {
      pvVar6 = copy_pnext_struct(this,(VkFragmentShadingRateAttachmentInfoKHR *)create_info._M_cur,
                                 alloc);
      if (pvVar6 == (void *)0x0) {
        return false;
      }
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR) {
      pvVar6 = copy_pnext_struct_simple<VkPipelineFragmentShadingRateStateCreateInfoKHR>
                         (this,(VkPipelineFragmentShadingRateStateCreateInfoKHR *)create_info._M_cur
                          ,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO) {
      pvVar6 = copy_pnext_struct(this,(VkRenderingAttachmentLocationInfoKHR *)create_info._M_cur,
                                 alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO) {
      pvVar6 = copy_pnext_struct(this,(VkRenderingInputAttachmentIndexInfoKHR *)create_info._M_cur,
                                 alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT) {
      pvVar6 = copy_pnext_struct_simple<VkAttachmentReferenceStencilLayout>
                         (this,(VkAttachmentReferenceStencilLayout *)create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT) {
      pvVar6 = copy_pnext_struct_simple<VkAttachmentDescriptionStencilLayout>
                         (this,(VkAttachmentDescriptionStencilLayout *)create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == 
             VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT) {
      pvVar6 = copy_pnext_struct_simple<VkPipelineRasterizationProvokingVertexStateCreateInfoEXT>
                         (this,(VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *)
                               create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO) {
      pvVar6 = copy_pnext_struct_simple<VkPipelineRasterizationLineStateCreateInfo>
                         (this,(VkPipelineRasterizationLineStateCreateInfo *)create_info._M_cur,
                          alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT) {
      pvVar6 = copy_pnext_struct_simple<VkDepthBiasRepresentationInfoEXT>
                         (this,(VkDepthBiasRepresentationInfoEXT *)create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT) {
      pvVar6 = copy_pnext_struct_simple<VkSamplerCustomBorderColorCreateInfoEXT>
                         (this,(VkSamplerCustomBorderColorCreateInfoEXT *)create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR) {
      pvVar6 = copy_pnext_struct(this,(VkPipelineLibraryCreateInfoKHR *)create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_MEMORY_BARRIER_2) {
      pvVar6 = copy_pnext_struct_simple<VkMemoryBarrier2>
                         (this,(VkMemoryBarrier2 *)create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT) {
      ci_28 = (VkShaderModuleCreateInfo *)create_info._M_cur;
      pvVar6 = copy_pnext_struct_simple<VkGraphicsPipelineLibraryCreateInfoEXT>
                         (this,(VkGraphicsPipelineLibraryCreateInfoEXT *)create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT) {
      pvVar6 = copy_pnext_struct(this,(VkMutableDescriptorTypeCreateInfoEXT *)create_info._M_cur,
                                 alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT) {
      pvVar6 = copy_pnext_struct_simple<VkPipelineViewportDepthClipControlCreateInfoEXT>
                         (this,(VkPipelineViewportDepthClipControlCreateInfoEXT *)create_info._M_cur
                          ,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT) {
      pvVar6 = copy_pnext_struct_simple<VkMultisampledRenderToSingleSampledInfoEXT>
                         (this,(VkMultisampledRenderToSingleSampledInfoEXT *)create_info._M_cur,
                          alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT) {
      pvVar6 = copy_pnext_struct(this,(VkPipelineColorWriteCreateInfoEXT *)create_info._M_cur,alloc,
                                 dynamic_state_info);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT) {
      pvVar6 = copy_pnext_struct_simple<VkSamplerBorderColorComponentMappingCreateInfoEXT>
                         (this,(VkSamplerBorderColorComponentMappingCreateInfoEXT *)
                               create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT) {
      pvVar6 = copy_pnext_struct_simple<VkRenderPassCreationControlEXT>
                         (this,(VkRenderPassCreationControlEXT *)create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT) {
      pvVar6 = copy_pnext_struct(this,(VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)
                                      create_info._M_cur,alloc);
      *(void **)pin = pvVar6;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO) {
      pvVar6 = copy_pnext_struct_simple<VkPipelineCreateFlags2CreateInfo>
                         (this,(VkPipelineCreateFlags2CreateInfo *)create_info._M_cur,alloc);
      VVar5 = normalize_pipeline_creation_flags(*(VkPipelineCreateFlags2KHR *)((long)pvVar6 + 0x10))
      ;
      *(VkPipelineCreateFlags2KHR *)((long)pvVar6 + 0x10) = VVar5;
      *(void **)pin = pvVar6;
    }
    else {
      if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT) {
        LVar3 = get_thread_log_level();
        if (((int)LVar3 < 3) &&
           (bVar2 = Internal::log_thread_callback
                              (LOG_ERROR,"Cannot copy unknown pNext sType: %d.\n",
                               (ulong)*(VkStructureType *)
                                       &((create_info._M_cur)->super__Hash_node_base)._M_nxt),
           !bVar2)) {
          fprintf(_stderr,"Fossilize ERROR: Cannot copy unknown pNext sType: %d.\n",
                  (ulong)*(VkStructureType *)&((create_info._M_cur)->super__Hash_node_base)._M_nxt);
        }
        return false;
      }
      pvVar6 = copy_pnext_struct(this,(VkPipelineViewportDepthClampControlCreateInfoEXT *)
                                      create_info._M_cur,alloc,dynamic_state_info);
      *(void **)pin = pvVar6;
    }
    alloc_local = *(ScratchAllocator **)
                   &((create_info._M_cur)->
                    super__Hash_node_value<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_false>
                    ).
                    super__Hash_node_value_base<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>
                    ._M_storage._M_storage.__align;
    pin = (VkBaseInStructure *)(*(long *)pin + 8);
    *(undefined8 *)pin = 0;
  } while( true );
}

Assistant:

bool StateRecorder::Impl::copy_pnext_chain(const void *pNext, ScratchAllocator &alloc, const void **out_pnext,
                                           const DynamicStateInfo *dynamic_state_info,
                                           VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	VkBaseInStructure new_pnext = {};
	const VkBaseInStructure **ppNext = &new_pnext.pNext;

	while ((pNext = pnext_chain_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
		{
			auto ci = static_cast<const VkPipelineTessellationDomainOriginStateCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineVertexInputDivisorStateCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationStateStreamCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
		{
			auto *ci = static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineColorBlendAdvancedStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationConservativeStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT:
		{
			auto *ci = static_cast<const VkAttachmentDescriptionStencilLayout *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT:
		{
			auto *ci = static_cast<const VkAttachmentReferenceStencilLayout *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
		{
			auto *ci = static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext);
			auto *resolve = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			if (!resolve)
				return false;
			*ppNext = resolve;
			break;
		}

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
		{
			auto *ci = static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext);
			auto *rate = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			if (!rate)
				return false;
			*ppNext = rate;
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, state_flags));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineColorWriteCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
		{
			auto *ci = static_cast<const VkSamplerReductionModeCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
		{
			auto *ci = static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineDiscardRectangleStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
		{
			auto *ci = static_cast<const VkMemoryBarrier2KHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineFragmentShadingRateStateCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
		{
			auto *ci = static_cast<const VkSamplerYcbcrConversionCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO:
		{
			// Special case. Instead of serializing the YCbCr object link, serialize the original create info.
			// Reduces excessive churn for supporting an extremely niche object type.
			auto *ci = static_cast<const VkSamplerYcbcrConversionInfo *>(pNext);
			auto ycbcr = ycbcr_conversions.find(ci->conversion);
			if (ycbcr == ycbcr_conversions.end())
				return false;

			VkSamplerYcbcrConversionCreateInfo *new_create_info;
			if (!copy_ycbcr_conversion(ycbcr->second, alloc, &new_create_info))
				return false;

			*ppNext = reinterpret_cast<VkBaseInStructure *>(new_create_info);
			break;
		}

		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkGraphicsPipelineLibraryCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO:
		{
			auto *ci = static_cast<const VkShaderModuleCreateInfo *>(pNext);
			VkShaderModuleCreateInfo *new_module = nullptr;
			if (!copy_shader_module(ci, alloc, true, &new_module))
				return false;
			*ppNext = reinterpret_cast<VkBaseInStructure *>(new_module);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineLibraryCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineViewportDepthClipControlCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineShaderStageModuleIdentifierCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineCreateFlags2CreateInfoKHR *>(pNext);
			auto *flags2 = static_cast<VkPipelineCreateFlags2CreateInfoKHR *>(copy_pnext_struct_simple(ci, alloc));
			flags2->flags = normalize_pipeline_creation_flags(flags2->flags);
			*ppNext = reinterpret_cast<VkBaseInStructure *>(flags2);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
		{
			auto *ci = static_cast<const VkRenderPassCreationControlEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkSamplerBorderColorComponentMappingCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
		{
			auto *ci = static_cast<const VkMultisampledRenderToSingleSampledInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
		{
			auto *ci = static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkRenderPassFragmentDensityMapCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
		{
			auto *ci = static_cast<const VkSampleLocationsInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineViewportDepthClampControlCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
		{
			auto *ci = static_cast<const VkRenderingAttachmentLocationInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
		{
			auto *ci = static_cast<const VkRenderingInputAttachmentIndexInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		default:
			LOGE_LEVEL("Cannot copy unknown pNext sType: %d.\n", int(pin->sType));
			return false;
		}

		pNext = pin->pNext;
		ppNext = const_cast<const VkBaseInStructure **>(&(*ppNext)->pNext);
		*ppNext = nullptr;
	}

	*out_pnext = new_pnext.pNext;
	return true;
}